

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

void EDLines::UpdateLineParameters(LineSegment *ls)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = ls->sx;
  dVar1 = ls->sy;
  dVar2 = ls->ex - dVar4;
  dVar3 = ls->ey - dVar1;
  if (ABS(dVar3) <= ABS(dVar2)) {
    ls->invert = 0;
    if (0.001 <= ABS(dVar3)) {
      ls->b = dVar3 / dVar2;
      dVar4 = dVar1 - (dVar3 / dVar2) * dVar4;
    }
    else {
      ls->b = 0.0;
      dVar4 = (ls->ey + dVar1) * 0.5;
    }
  }
  else {
    ls->invert = 1;
    if (0.001 <= ABS(dVar2)) {
      ls->b = dVar2 / dVar3;
      dVar4 = dVar4 - (dVar2 / dVar3) * dVar1;
    }
    else {
      ls->b = 0.0;
      dVar4 = (ls->ex + dVar4) * 0.5;
    }
  }
  ls->a = dVar4;
  return;
}

Assistant:

void EDLines::UpdateLineParameters(LineSegment * ls)
{
	double dx = ls->ex - ls->sx;
	double dy = ls->ey - ls->sy;

	if (fabs(dx) >= fabs(dy)) {
		/// Line will be of the form y = a + bx
		ls->invert = 0;
		if (fabs(dy) < 1e-3) { ls->b = 0; ls->a = (ls->sy + ls->ey) / 2; }
		else {
			ls->b = dy / dx;
			ls->a = ls->sy - (ls->b)*ls->sx;
		} //end-else

	}
	else {
		/// Line will be of the form x = a + by
		ls->invert = 1;
		if (fabs(dx) < 1e-3) { ls->b = 0; ls->a = (ls->sx + ls->ex) / 2; }
		else {
			ls->b = dx / dy;
			ls->a = ls->sx - (ls->b)*ls->sy;
		} //end-else
	} //end-else
}